

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

int Gia_ManBuiltInSimCheckOver(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  word *pwVar2;
  word *pwVar3;
  int local_34;
  int w;
  word *pInfo1;
  word *pInfo0;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit0);
  pwVar2 = Gia_ManBuiltInData(p,iVar1);
  iVar1 = Abc_Lit2Var(iLit1);
  pwVar3 = Gia_ManBuiltInData(p,iVar1);
  if ((p->fBuiltInSim == 0) && (p->fIncrSim == 0)) {
    __assert_fail("p->fBuiltInSim || p->fIncrSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                  ,0x35f,"int Gia_ManBuiltInSimCheckOver(Gia_Man_t *, int, int)");
  }
  iVar1 = Abc_LitIsCompl(iLit0);
  if (iVar1 == 0) {
    iVar1 = Abc_LitIsCompl(iLit1);
    if (iVar1 == 0) {
      for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
        if ((pwVar2[local_34] & pwVar3[local_34]) != 0) {
          return 1;
        }
      }
    }
    else {
      for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
        if ((pwVar2[local_34] & (pwVar3[local_34] ^ 0xffffffffffffffff)) != 0) {
          return 1;
        }
      }
    }
  }
  else {
    iVar1 = Abc_LitIsCompl(iLit1);
    if (iVar1 == 0) {
      for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
        if (((pwVar2[local_34] ^ 0xffffffffffffffff) & pwVar3[local_34]) != 0) {
          return 1;
        }
      }
    }
    else {
      for (local_34 = 0; local_34 < p->nSimWords; local_34 = local_34 + 1) {
        if (((pwVar2[local_34] ^ 0xffffffffffffffff) & (pwVar3[local_34] ^ 0xffffffffffffffff)) != 0
           ) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Gia_ManBuiltInSimCheckOver( Gia_Man_t * p, int iLit0, int iLit1 )
{
    word * pInfo0 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit0) );
    word * pInfo1 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit1) ); int w;
    assert( p->fBuiltInSim || p->fIncrSim );

//    printf( "%d %d\n", Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1) );
//    Extra_PrintBinary( stdout, pInfo0, 64*p->nSimWords ); printf( "\n" );
//    Extra_PrintBinary( stdout, pInfo1, 64*p->nSimWords ); printf( "\n" );
//    printf( "\n" );

    if ( Abc_LitIsCompl(iLit0) )
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] & ~pInfo1[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] & pInfo1[w] )
                    return 1;
        }
    }
    else 
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] & ~pInfo1[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] & pInfo1[w] )
                    return 1;
        }
    }
    return 0;
}